

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_insert_window(nk_context *ctx,nk_window *win,nk_window_insert_location loc)

{
  nk_window *pnVar1;
  nk_window *end;
  nk_window *iter;
  nk_window_insert_location loc_local;
  nk_window *win_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4842,
                  "void nk_insert_window(struct nk_context *, struct nk_window *, enum nk_window_insert_location)"
                 );
  }
  if (win == (nk_window *)0x0) {
    __assert_fail("win",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4843,
                  "void nk_insert_window(struct nk_context *, struct nk_window *, enum nk_window_insert_location)"
                 );
  }
  if ((win != (nk_window *)0x0) && (ctx != (nk_context *)0x0)) {
    for (end = ctx->begin; end != (nk_window *)0x0; end = end->next) {
      if (end == end->next) {
        __assert_fail("iter != iter->next",
                      "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                      ,0x4848,
                      "void nk_insert_window(struct nk_context *, struct nk_window *, enum nk_window_insert_location)"
                     );
      }
      if (end == win) {
        __assert_fail("iter != win",
                      "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                      ,0x4849,
                      "void nk_insert_window(struct nk_context *, struct nk_window *, enum nk_window_insert_location)"
                     );
      }
      if (end == win) {
        return;
      }
    }
    if (ctx->begin == (nk_window *)0x0) {
      win->next = (nk_window *)0x0;
      win->prev = (nk_window *)0x0;
      ctx->begin = win;
      ctx->end = win;
      ctx->count = 1;
    }
    else {
      if (loc == NK_INSERT_BACK) {
        pnVar1 = ctx->end;
        pnVar1->flags = pnVar1->flags | 0x1000;
        pnVar1->next = win;
        win->prev = ctx->end;
        win->next = (nk_window *)0x0;
        ctx->end = win;
        ctx->active = ctx->end;
        ctx->end->flags = ctx->end->flags & 0xffffefff;
      }
      else {
        ctx->begin->prev = win;
        win->next = ctx->begin;
        win->prev = (nk_window *)0x0;
        ctx->begin = win;
        ctx->begin->flags = ctx->begin->flags & 0xffffefff;
      }
      ctx->count = ctx->count + 1;
    }
  }
  return;
}

Assistant:

NK_INTERN void
nk_insert_window(struct nk_context *ctx, struct nk_window *win,
    enum nk_window_insert_location loc)
{
    const struct nk_window *iter;
    NK_ASSERT(ctx);
    NK_ASSERT(win);
    if (!win || !ctx) return;

    iter = ctx->begin;
    while (iter) {
        NK_ASSERT(iter != iter->next);
        NK_ASSERT(iter != win);
        if (iter == win) return;
        iter = iter->next;
    }

    if (!ctx->begin) {
        win->next = 0;
        win->prev = 0;
        ctx->begin = win;
        ctx->end = win;
        ctx->count = 1;
        return;
    }
    if (loc == NK_INSERT_BACK) {
        struct nk_window *end;
        end = ctx->end;
        end->flags |= NK_WINDOW_ROM;
        end->next = win;
        win->prev = ctx->end;
        win->next = 0;
        ctx->end = win;
        ctx->active = ctx->end;
        ctx->end->flags &= ~(nk_flags)NK_WINDOW_ROM;
    } else {
        /*ctx->end->flags |= NK_WINDOW_ROM;*/
        ctx->begin->prev = win;
        win->next = ctx->begin;
        win->prev = 0;
        ctx->begin = win;
        ctx->begin->flags &= ~(nk_flags)NK_WINDOW_ROM;
    }
    ctx->count++;
}